

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall xmrig::Client::Client(Client *this,int id,char *agent,IClientListener *listener)

{
  uintptr_t uVar1;
  Dns *this_00;
  
  BaseClient::BaseClient(&this->super_BaseClient,id,listener);
  (this->super_BaseClient).super_IClient._vptr_IClient = (_func_int **)&PTR__Client_001bb230;
  (this->super_IDnsListener)._vptr_IDnsListener = (_func_int **)&PTR__Client_001bb320;
  (this->super_ILineListener)._vptr_ILineListener = (_func_int **)&PTR__Client_001bb348;
  memset(this->m_sendBuf,0,0x800);
  this->m_agent = agent;
  memset(&this->m_recvBuf,0,0x4058);
  uVar1 = Storage<xmrig::Client>::add((Storage<xmrig::Client> *)m_storage,this);
  this->m_key = uVar1;
  this_00 = (Dns *)operator_new(0x90);
  Dns::Dns(this_00,&this->super_IDnsListener);
  this->m_dns = this_00;
  return;
}

Assistant:

xmrig::Client::Client(int id, const char *agent, IClientListener *listener) :
    BaseClient(id, listener),
    m_agent(agent)
{
    m_key = m_storage.add(this);
    m_dns = new Dns(this);
}